

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts2cb.c
# Opt level: O2

uint32 * cont_ts2cb(uint32 n_ts)

{
  uint32 *puVar1;
  ulong uVar2;
  
  puVar1 = (uint32 *)
           __ckd_calloc__((ulong)n_ts,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ts2cb.c"
                          ,0x3e);
  for (uVar2 = 0; n_ts != uVar2; uVar2 = uVar2 + 1) {
    puVar1[uVar2] = (uint32)uVar2;
  }
  return puVar1;
}

Assistant:

uint32 *
cont_ts2cb(uint32 n_ts)
{
    uint32 *out, i;

    out = ckd_calloc(n_ts, sizeof(uint32));
    for (i = 0; i < n_ts; i++) {
	out[i] = i;
    }

    return out;
}